

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

int __thiscall
google::protobuf::internal::EpsCopyInputStream::PushLimit
          (EpsCopyInputStream *this,char *ptr,int limit)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  int old_limit;
  int local_6c [22];
  int local_14 [5];
  
  local_14[0] = (in_ESI - (int)in_RDI[1]) + in_EDX;
  lVar2 = in_RDI[1];
  local_6c[0] = 0;
  piVar3 = std::min<int>(local_6c,local_14);
  *in_RDI = lVar2 + *piVar3;
  iVar1 = *(int *)((long)in_RDI + 0x1c);
  *(int *)((long)in_RDI + 0x1c) = local_14[0];
  return iVar1 - local_14[0];
}

Assistant:

PROTOBUF_MUST_USE_RESULT int PushLimit(const char* ptr, int limit) {
    GOOGLE_DCHECK(limit >= 0 && limit <= INT_MAX - kSlopBytes);
    // This add is safe due to the invariant above, because
    // ptr - buffer_end_ <= kSlopBytes.
    limit += static_cast<int>(ptr - buffer_end_);
    limit_end_ = buffer_end_ + (std::min)(0, limit);
    auto old_limit = limit_;
    limit_ = limit;
    return old_limit - limit;
  }